

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QList<QGridLayoutBox> * __thiscall
QList<QGridLayoutBox>::fill(QList<QGridLayoutBox> *this,parameter_type t,qsizetype newSize)

{
  qreal qVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  qreal qVar8;
  qreal qVar9;
  qreal qVar10;
  qreal qVar11;
  qreal qVar12;
  QGridLayoutBox *pQVar13;
  QGridLayoutBox *pQVar14;
  long lVar15;
  qreal *pqVar16;
  long lVar17;
  long lVar18;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar2 = (this->d).d;
  lVar17 = newSize;
  if (pDVar2 != (Data *)0x0) {
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar2 == (Data *)0x0) {
        lVar15 = 0;
      }
      else {
        lVar15 = (pDVar2->super_QArrayData).alloc;
      }
      if (newSize <= lVar15) {
        uVar4 = *(undefined4 *)&t->q_minimumSize;
        uVar5 = *(undefined4 *)((long)&t->q_minimumSize + 4);
        uVar6 = *(undefined4 *)&t->q_preferredSize;
        uVar7 = *(undefined4 *)((long)&t->q_preferredSize + 4);
        qVar8 = t->q_maximumSize;
        qVar9 = t->q_minimumDescent;
        qVar1 = t->q_minimumAscent;
        lVar17 = (this->d).size;
        if (newSize <= lVar17) {
          lVar17 = newSize;
        }
        if (lVar17 != 0) {
          pQVar14 = (this->d).ptr;
          lVar15 = 0;
          do {
            *(qreal *)((long)&pQVar14->q_minimumAscent + lVar15) = t->q_minimumAscent;
            qVar10 = t->q_minimumSize;
            qVar11 = t->q_preferredSize;
            qVar12 = t->q_minimumDescent;
            pqVar16 = (qreal *)((long)&pQVar14->q_maximumSize + lVar15);
            *pqVar16 = t->q_maximumSize;
            pqVar16[1] = qVar12;
            pqVar16 = (qreal *)((long)&pQVar14->q_minimumSize + lVar15);
            *pqVar16 = qVar10;
            pqVar16[1] = qVar11;
            lVar15 = lVar15 + 0x28;
          } while (lVar17 * 0x28 != lVar15);
        }
        lVar17 = (this->d).size;
        if (lVar17 < newSize) {
          if (newSize != lVar17) {
            lVar15 = (this->d).size;
            pqVar16 = &(this->d).ptr[lVar15].q_minimumAscent;
            lVar18 = 0;
            do {
              *(undefined4 *)&((QGridLayoutBox *)(pqVar16 + -4))->q_minimumSize = uVar4;
              *(undefined4 *)((long)pqVar16 + -0x1c) = uVar5;
              *(undefined4 *)(pqVar16 + -3) = uVar6;
              *(undefined4 *)((long)pqVar16 + -0x14) = uVar7;
              pqVar16[-2] = qVar8;
              pqVar16[-1] = qVar9;
              *pqVar16 = qVar1;
              pqVar16 = pqVar16 + 5;
              lVar18 = lVar18 + -1;
            } while (lVar17 - newSize != lVar18);
            (this->d).size = lVar15 - lVar18;
          }
        }
        else if (newSize < lVar17) {
          (this->d).size = newSize;
        }
        goto LAB_0054451e;
      }
    }
    if (pDVar2 != (Data *)0x0) {
      lVar17 = (pDVar2->super_QArrayData).alloc;
      if (lVar17 <= newSize) {
        lVar17 = newSize;
      }
      if (((pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
        lVar17 = newSize;
      }
    }
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar13 = (QGridLayoutBox *)QArrayData::allocate(&local_30,0x28,0x10,lVar17,KeepSize);
  pQVar14 = pQVar13;
  lVar17 = newSize;
  if (newSize == 0) {
    newSize = 0;
  }
  else {
    do {
      pQVar14->q_minimumAscent = t->q_minimumAscent;
      uVar4 = *(undefined4 *)&t->q_minimumSize;
      uVar5 = *(undefined4 *)((long)&t->q_minimumSize + 4);
      uVar6 = *(undefined4 *)&t->q_preferredSize;
      uVar7 = *(undefined4 *)((long)&t->q_preferredSize + 4);
      qVar1 = t->q_minimumDescent;
      pQVar14->q_maximumSize = t->q_maximumSize;
      pQVar14->q_minimumDescent = qVar1;
      *(undefined4 *)&pQVar14->q_minimumSize = uVar4;
      *(undefined4 *)((long)&pQVar14->q_minimumSize + 4) = uVar5;
      *(undefined4 *)&pQVar14->q_preferredSize = uVar6;
      *(undefined4 *)((long)&pQVar14->q_preferredSize + 4) = uVar7;
      lVar17 = lVar17 + -1;
      pQVar14 = pQVar14 + 1;
    } while (lVar17 != 0);
  }
  pQVar3 = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)local_30;
  (this->d).ptr = pQVar13;
  (this->d).size = newSize;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,0x28,0x10);
    }
  }
LAB_0054451e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}